

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase1162::run(TestCase1162 *this)

{
  Fault node;
  PromiseArenaMember *node_00;
  Disposer *node_01;
  long *plVar1;
  size_t sVar2;
  int iVar3;
  undefined8 *puVar4;
  MonotonicClock *pMVar5;
  undefined4 extraout_var;
  char *pcVar6;
  long *in_R8;
  Fault f;
  OwnFd originalDirFd;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>
  _kjDefer1175;
  Own<kj::NetworkAddress,_std::nullptr_t> addr;
  Own<kj::ConnectionReceiver,_std::nullptr_t> listener;
  String address;
  AsyncIoContext ioContext;
  Fault local_108;
  OwnFd local_fc;
  PromiseArenaMember *local_f8;
  anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>_2
  aStack_f0;
  Own<kj::ConnectionReceiver,_std::nullptr_t> local_e0;
  long *local_d0;
  undefined8 *local_c8;
  long *local_c0;
  String local_b8;
  undefined8 *local_98;
  long *local_90;
  undefined8 *local_88;
  long *local_80;
  OwnPromiseNode local_68;
  long *local_60;
  char *local_58;
  char *pcStack_50;
  undefined8 local_48;
  char *local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  setupAsyncIo();
  puVar4 = (undefined8 *)(**(code **)(*local_80 + 0x18))();
  pMVar5 = systemPreciseMonotonicClock();
  iVar3 = (**pMVar5->_vptr_MonotonicClock)(pMVar5);
  local_e0.ptr._0_4_ = getpid();
  local_f8 = (PromiseArenaMember *)CONCAT44(extraout_var,iVar3);
  str<char_const(&)[18],int,long>
            (&local_b8,(kj *)"unix-abstract:foo",(char (*) [18])&local_e0.ptr,(int *)&local_f8,in_R8
            );
  pcVar6 = local_b8.content.ptr;
  if (local_b8.content.size_ == 0) {
    pcVar6 = "";
  }
  (**(code **)*puVar4)
            (&local_f8,puVar4,pcVar6,local_b8.content.size_ + (local_b8.content.size_ == 0),0);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_38 = "run";
  local_30 = 0x1e00000490;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)&local_e0.ptr,&local_f8);
  node_00 = local_f8;
  if (local_f8 != (PromiseArenaMember *)0x0) {
    local_f8 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node_00);
  }
  (**(code **)(*local_d0 + 0x10))(&local_c8);
  do {
    local_fc.fd = open(".",0x90000);
    if (-1 < local_fc.fd) {
      iVar3 = 0;
      break;
    }
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    local_108.exception = (Exception *)0x0;
    local_f8 = (PromiseArenaMember *)0x0;
    aStack_f0 = (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>_2
                 )0x0;
    kj::_::Debug::Fault::init
              (&local_108,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal(&local_108);
  }
  do {
    iVar3 = chdir("/");
    if (-1 < iVar3) {
      iVar3 = 0;
      break;
    }
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    local_108.exception = (Exception *)0x0;
    local_f8 = (PromiseArenaMember *)0x0;
    aStack_f0 = (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>_2
                 )0x0;
    kj::_::Debug::Fault::init
              (&local_108,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
              );
    kj::_::Debug::Fault::fatal(&local_108);
  }
  local_f8 = (PromiseArenaMember *)CONCAT71(local_f8._1_7_,1);
  aStack_f0 = (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>_2
               )&local_fc;
  (**(code **)*local_d0)(&local_e0);
  Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>::
  attach<kj::Own<kj::ConnectionReceiver,decltype(nullptr)>>
            ((Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>> *)&local_108,&local_e0);
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_50 = "run";
  local_48 = 0x300000499;
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_68,&local_108);
  plVar1 = local_60;
  if (local_60 != (long *)0x0) {
    local_60 = (long *)0x0;
    (**((local_68.ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember)
              (local_68.ptr,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  node.exception = local_108.exception;
  if (local_108.exception != (Exception *)0x0) {
    local_108.exception = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
  }
  node_01 = local_e0.disposer;
  if ((PromiseArenaMember *)local_e0.disposer != (PromiseArenaMember *)0x0) {
    local_e0.disposer = (Disposer *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_01);
  }
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:1175:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>
               *)&local_f8);
  OwnFd::~OwnFd(&local_fc);
  plVar1 = local_c0;
  if (local_c0 != (long *)0x0) {
    local_c0 = (long *)0x0;
    (**(code **)*local_c8)(local_c8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  plVar1 = local_d0;
  if (local_d0 != (long *)0x0) {
    local_d0 = (long *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_e0.ptr._4_4_,(__pid_t)local_e0.ptr))
              ((undefined8 *)CONCAT44(local_e0.ptr._4_4_,(__pid_t)local_e0.ptr),
               (long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  sVar2 = local_b8.content.size_;
  pcVar6 = local_b8.content.ptr;
  if (local_b8.content.ptr != (char *)0x0) {
    local_b8.content.ptr = (char *)0x0;
    local_b8.content.size_ = 0;
    (**(local_b8.content.disposer)->_vptr_ArrayDisposer)
              (local_b8.content.disposer,pcVar6,1,sVar2,sVar2,0);
  }
  plVar1 = local_80;
  if (local_80 != (long *)0x0) {
    local_80 = (long *)0x0;
    (**(code **)*local_88)(local_88,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  plVar1 = local_90;
  if (local_90 != (long *)0x0) {
    local_90 = (long *)0x0;
    (**(code **)*local_98)(local_98,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  return;
}

Assistant:

TEST(AsyncIo, AbstractUnixSocket) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();
  auto elapsedSinceEpoch = systemPreciseMonotonicClock().now() - kj::origin<TimePoint>();
  auto address = kj::str("unix-abstract:foo", getpid(), elapsedSinceEpoch / kj::NANOSECONDS);

  Own<NetworkAddress> addr = network.parseAddress(address).wait(ioContext.waitScope);

  Own<ConnectionReceiver> listener = addr->listen();
  // chdir proves no filesystem dependence. Test fails for regular unix socket
  // but passes for abstract unix socket.
  auto originalDirFd = KJ_SYSCALL_FD(open(".", O_RDONLY | O_DIRECTORY | O_CLOEXEC));
  KJ_SYSCALL(chdir("/"));
  KJ_DEFER(KJ_SYSCALL(fchdir(originalDirFd)));

  addr->connect().attach(kj::mv(listener)).wait(ioContext.waitScope);
}